

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type *key;
  AssertHelper *this_00;
  FILE *assertion_result;
  value_type actual_predicate_value;
  key_type expected_predicate_value;
  AssertHelper *this_01;
  value_type pcVar4;
  key_type file;
  char *pcVar5;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  size_type sVar6;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  bool *success;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  key_type *in_stack_fffffffffffff958;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff960;
  char **in_stack_fffffffffffff968;
  int iVar7;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff970;
  key_equal *in_stack_fffffffffffff978;
  int line;
  hasher *in_stack_fffffffffffff980;
  size_type in_stack_fffffffffffff988;
  Type TVar8;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  undefined6 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d6;
  undefined1 in_stack_fffffffffffff9d7;
  undefined4 in_stack_fffffffffffffa00;
  uint i_00;
  string local_5d0 [48];
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_5a0;
  undefined1 local_591;
  AssertionResult local_590;
  string local_580 [24];
  value_type *in_stack_fffffffffffffa98;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaa0;
  AssertionResult local_540 [2];
  key_type local_520;
  value_type local_4c8;
  AssertionResult local_4c0;
  string local_4b0 [48];
  key_type local_480;
  undefined1 local_471;
  AssertionResult local_470 [2];
  key_type local_450;
  value_type local_3f8;
  AssertionResult local_3f0 [2];
  key_type local_3d0;
  value_type local_378;
  AssertionResult local_370;
  string local_360 [55];
  undefined1 local_329;
  AssertionResult local_328;
  string local_318 [55];
  undefined1 local_2e1;
  AssertionResult local_2e0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_2d0;
  Hasher local_2c0;
  Hasher local_2b4;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  local_2a8;
  string local_200 [55];
  undefined1 local_1c9;
  AssertionResult local_1c8;
  string local_1b8 [55];
  undefined1 local_181;
  AssertionResult local_180;
  FILE *local_170;
  AssertHelper *local_168;
  key_type local_160;
  value_type local_100;
  int local_f4;
  key_type *local_f0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_d8;
  Hasher local_c8;
  Hasher local_bc;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  local_b0;
  
  bVar1 = google::
          HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    i_00 = 0;
    Hasher::Hasher(&local_bc,0);
    Hasher::Hasher(&local_c8,i_00);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc
              (&local_d8,i_00,(int *)(ulong)i_00);
    google::
    HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
               in_stack_fffffffffffff978,(allocator_type *)in_stack_fffffffffffff970);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d8);
    key = (key_type *)
          HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(in_stack_fffffffffffff970,(int)((ulong)in_stack_fffffffffffff968 >> 0x20));
    local_f0 = key;
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    for (local_f4 = 1; local_f4 < 100; local_f4 = local_f4 + 1) {
      local_100 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffff960,
                                 (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    }
    local_160 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff970,
                            (int)((ulong)in_stack_fffffffffffff968 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    this_00 = (AssertHelper *)
              HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff970,(int)((ulong)in_stack_fffffffffffff968 >> 0x20))
    ;
    local_168 = this_00;
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    assertion_result = tmpfile();
    local_181 = assertion_result != (FILE *)0x0;
    local_170 = assertion_result;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf47c8b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                  CONCAT16(in_stack_fffffffffffff9d6,in_stack_fffffffffffff9d0)),
                 in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,(Type)(in_stack_fffffffffffff988 >> 0x20)
                 ,(char *)in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                 (char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_1b8);
      testing::Message::~Message((Message *)0xf47d4e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf47de2);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>>
            ::serialize<ValueSerializer,_IO_FILE>(&local_b0,local_170);
    local_1c9 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf47e23);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9d6,in_stack_fffffffffffff9d0
                                                )),in_stack_fffffffffffff9c8,
                 in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,(Type)(in_stack_fffffffffffff988 >> 0x20)
                 ,(char *)in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                 (char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_200);
      testing::Message::~Message((Message *)0xf47ef8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf47f8f);
    rewind(local_170);
    Hasher::Hasher(&local_2b4,0);
    Hasher::Hasher(&local_2c0,0);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_2d0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
               in_stack_fffffffffffff978,(allocator_type *)in_stack_fffffffffffff970);
    TVar8 = (Type)(in_stack_fffffffffffff988 >> 0x20);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_2d0);
    local_2e1 = local_170 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf48037);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff9d6,in_stack_fffffffffffff9d0
                                                )),in_stack_fffffffffffff9c8,
                 in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_318);
      testing::Message::~Message((Message *)0xf4814b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf481df);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>>
            ::unserialize<ValueSerializer,_IO_FILE>(&local_2a8,local_170);
    local_329 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf48220);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d0)),
                 in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_360);
      testing::Message::~Message((Message *)0xf482f5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf4838c);
    fclose(local_170);
    actual_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff960,(int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    local_378 = actual_predicate_value;
    expected_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffff970,(int)((ulong)in_stack_fffffffffffff968 >> 0x20));
    local_3d0 = expected_predicate_value;
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(i_00,in_stack_fffffffffffffa00),key);
    google::
    sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf48413);
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              ((char *)in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               in_stack_fffffffffffff968,(char **)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::AssertionResult::failure_message((AssertionResult *)0xf48481);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf484de);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf4854f);
    local_3f8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff960,
                               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    local_450 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff970,
                            (int)((ulong)in_stack_fffffffffffff968 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(i_00,in_stack_fffffffffffffa00),key);
    google::
    sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf485c7);
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              ((char *)in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               in_stack_fffffffffffff968,(char **)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::AssertionResult::failure_message((AssertionResult *)0xf48635);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff990,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf48692);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf48703);
    local_480 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff970,
                            (int)((ulong)in_stack_fffffffffffff968 >> 0x20));
    this_01 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_471 = this_01 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf4876e);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_470);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d0)),
                 actual_predicate_value,expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_01,TVar8,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_4b0);
      testing::Message::~Message((Message *)0xf48843);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf488da);
    pcVar4 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff960,
                            (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    local_4c8 = pcVar4;
    file = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffff970,(int)((ulong)in_stack_fffffffffffff968 >> 0x20));
    TVar8 = (Type)((ulong)pcVar4 >> 0x20);
    local_520 = file;
    google::
    BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(i_00,in_stack_fffffffffffffa00),key);
    google::
    sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf48952);
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              ((char *)in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               in_stack_fffffffffffff968,(char **)in_stack_fffffffffffff960);
    line = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
    iVar7 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0xf489c0);
      line = (int)((ulong)pcVar5 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (this_01,TVar8,file,line,(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf48a1d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf48a8e);
    this_02 = (HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueKey(in_stack_fffffffffffff970,iVar7);
    sVar6 = google::
            BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    iVar7 = (int)(sVar6 >> 0x20);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf48af9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_540);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d0)),
                 actual_predicate_value,expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper(this_01,TVar8,file,line,(char *)this_02);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_580);
      testing::Message::~Message((Message *)0xf48bce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf48c65);
    this_03 = (BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueKey(this_02,iVar7);
    local_5a0 = this_03;
    success = (bool *)google::
                      BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count(this_03,in_stack_fffffffffffff958);
    local_591 = success == (bool *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_03,success,(type *)0xf48cce);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff9d0)),
                 actual_predicate_value,expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper(this_01,TVar8,file,line,(char *)this_02);
      testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
      std::__cxx11::string::~string(local_5d0);
      testing::Message::~Message((Message *)0xf48da3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf48e37);
    google::
    HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)0xf48e44);
    google::
    HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)0xf48e51);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}